

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O2

size_t varbuff_to_bytes(uchar *bytes,size_t bytes_len,uchar *bytes_out)

{
  size_t sVar1;
  
  sVar1 = varint_to_bytes(bytes_len,bytes_out);
  if (bytes_len != 0) {
    memcpy(bytes_out + sVar1,bytes,bytes_len);
  }
  return sVar1 + bytes_len;
}

Assistant:

size_t varbuff_to_bytes(const unsigned char *bytes, size_t bytes_len,
                        unsigned char *bytes_out)
{
    size_t n = varint_to_bytes(bytes_len, bytes_out);
    bytes_out += n;
    if (bytes_len)
        memcpy(bytes_out, bytes, bytes_len);
    return n + bytes_len;
}